

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

void __thiscall File::~File(File *this)

{
  Tag *this_00;
  size_type sVar1;
  reference ppTVar2;
  uint local_14;
  uint i;
  File *this_local;
  
  this->_vptr_File = (_func_int **)&PTR_load_00111bb0;
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<Tag_*,_std::allocator<Tag_*>_>::size(&this->_tags);
    if (sVar1 <= local_14) break;
    ppTVar2 = std::vector<Tag_*,_std::allocator<Tag_*>_>::operator[](&this->_tags,(ulong)local_14);
    if (*ppTVar2 != (value_type)0x0) {
      ppTVar2 = std::vector<Tag_*,_std::allocator<Tag_*>_>::operator[](&this->_tags,(ulong)local_14)
      ;
      this_00 = *ppTVar2;
      if (this_00 != (Tag *)0x0) {
        Tag::~Tag(this_00);
        operator_delete(this_00,0x60);
      }
      ppTVar2 = std::vector<Tag_*,_std::allocator<Tag_*>_>::operator[](&this->_tags,(ulong)local_14)
      ;
      *ppTVar2 = (value_type)0x0;
    }
    local_14 = local_14 + 1;
  }
  std::vector<Tag_*,_std::allocator<Tag_*>_>::~vector(&this->_tags);
  return;
}

Assistant:

File::~File()
{
	for ( unsigned int i = 0; i < _tags.size();i++ )
	{
		if ( _tags[i] != NULL )
		{
			delete _tags[i];
			_tags[i] = NULL;
		}
	}
}